

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Outlining.cpp
# Opt level: O1

void __thiscall
wasm::ReconstructStringifyWalker::startExistingFunction
          (ReconstructStringifyWalker *this,Function *func)

{
  Fatal local_1e0;
  undefined1 local_58 [8];
  Result<wasm::Expression_*> _val;
  
  IRBuilder::build((Result<wasm::Expression_*> *)local_58,&this->existingBuilder);
  if (_val.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
      super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
      super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
      super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
      super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_u._24_1_ == '\x01') {
    Fatal::Fatal(&local_1e0);
    Fatal::operator<<(&local_1e0,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58)
    ;
  }
  else {
    std::__detail::__variant::_Variant_storage<false,_wasm::Expression_*,_wasm::Err>::
    ~_Variant_storage((_Variant_storage<false,_wasm::Expression_*,_wasm::Err> *)local_58);
    IRBuilder::visitFunctionStart((Result<wasm::Ok> *)local_58,&this->existingBuilder,func);
    if (_val.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
        super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
        super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
        super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
        super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
        super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_u._24_1_ != '\x01') {
      std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_58);
      this->seqCounter = 0;
      this->instrCounter = 0;
      this->state = NotInSeq;
      return;
    }
    Fatal::Fatal(&local_1e0);
    Fatal::operator<<(&local_1e0,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58)
    ;
  }
  Fatal::~Fatal(&local_1e0);
}

Assistant:

void startExistingFunction(Function* func) {
    ASSERT_OK(existingBuilder.build());
    ASSERT_OK(existingBuilder.visitFunctionStart(func));
    instrCounter = 0;
    seqCounter = 0;
    state = NotInSeq;
    ODBG(std::cerr << "\n"
                   << "Func Start to $" << func->name << " at "
                   << &existingBuilder << "\n");
  }